

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Gia_Man_t * Gia_ManInterOneInt(Gia_Man_t *pCof1,Gia_Man_t *pCof0,int Depth)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  void *__s;
  undefined8 *puVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000014;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  Gia_Man_t *pInter [2];
  Gia_Man_t *pGia [2];
  Gia_Man_t *pCof [2] [2];
  long local_a8;
  Gia_Man_t *local_98 [2];
  undefined8 local_88;
  undefined8 *local_80;
  Gia_Man_t *local_78 [4];
  undefined8 local_58 [5];
  
  local_88 = CONCAT44(in_register_00000014,Depth);
  local_78[0] = pCof0;
  local_78[1] = pCof1;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  if (pCof1->nObjs != pCof1->vCis->nSize + pCof1->vCos->nSize + 1) {
    iVar2 = pCof0->vCis->nSize;
    if (pCof0->nObjs != pCof0->vCos->nSize + iVar2 + 1) {
      iVar4 = 0x10;
      if (0xe < iVar2 - 1U) {
        iVar4 = iVar2;
      }
      if (iVar4 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar4 << 2);
      }
      if (__s != (void *)0x0) {
        memset(__s,0,(long)iVar2 * 4);
      }
      lVar15 = 0;
      do {
        pGVar5 = local_78[lVar15];
        if ((0 < pGVar5->nObjs) && (pGVar11 = pGVar5->pObjs, pGVar11 != (Gia_Obj_t *)0x0)) {
          lVar12 = 0;
          do {
            uVar13 = *(ulong *)pGVar11 & 0x1fffffff;
            if (uVar13 != 0x1fffffff && -1 < (int)*(ulong *)pGVar11) {
              uVar3 = *(undefined8 *)((long)pGVar11 + (ulong)(uint)((int)uVar13 << 2) * -3);
              if (((uint)uVar3 & 0x9fffffff) == 0x9fffffff) {
                uVar14 = (uint)((ulong)uVar3 >> 0x20);
                if (iVar2 <= (int)(uVar14 & 0x1fffffff)) goto LAB_0039b27c;
                piVar1 = (int *)((long)__s + (ulong)(uVar14 & 0x1fffffff) * 4);
                *piVar1 = *piVar1 + 1;
              }
              uVar3 = *(undefined8 *)
                       ((long)pGVar11 +
                       (ulong)((*(uint *)&pGVar11->field_0x4 & 0x1fffffff) << 2) * -3);
              if (((uint)uVar3 & 0x9fffffff) == 0x9fffffff) {
                uVar14 = (uint)((ulong)uVar3 >> 0x20);
                if (iVar2 <= (int)(uVar14 & 0x1fffffff)) {
LAB_0039b27c:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                piVar1 = (int *)((long)__s + (ulong)(uVar14 & 0x1fffffff) * 4);
                *piVar1 = *piVar1 + 1;
              }
            }
            lVar12 = lVar12 + 1;
            pGVar11 = pGVar11 + 1;
          } while (lVar12 < pGVar5->nObjs);
        }
        bVar16 = lVar15 != 0;
        lVar15 = lVar15 + 1;
        if (bVar16) {
          if (iVar2 < 1) {
            iVar4 = -1;
          }
          else {
            uVar13 = 0;
            uVar10 = 0xffffffff;
            iVar8 = 0;
            do {
              iVar4 = *(int *)((long)__s + uVar13 * 4);
              iVar9 = iVar8;
              if (iVar8 <= iVar4) {
                iVar9 = iVar4;
              }
              if (iVar8 < iVar4) {
                uVar10 = uVar13 & 0xffffffff;
              }
              iVar4 = (int)uVar10;
              uVar13 = uVar13 + 1;
              iVar8 = iVar9;
            } while ((long)iVar2 != uVar13);
          }
          if (__s != (void *)0x0) {
            free(__s);
          }
          uVar14 = 8 - (int)local_88;
          puVar6 = local_58;
          local_a8 = 0;
          do {
            local_78[3] = local_78[local_a8];
            uVar13 = 0;
            local_80 = puVar6;
            do {
              pGVar5 = Gia_ManDupCofactorVar(local_78[3],iVar4,(int)uVar13);
              puVar6 = local_80;
              local_80[uVar13] = pGVar5;
              pGVar7 = Acb_NtkEcoSynthesize(pGVar5);
              puVar6[uVar13] = pGVar7;
              Gia_ManStop(pGVar5);
              printf("%*sCof%d%d : ",(ulong)uVar14,"",local_a8,uVar13 & 0xffffffff);
              Gia_ManPrintStats(pGVar7,(Gps_Par_t *)0x0);
              uVar13 = uVar13 + 1;
            } while (uVar13 == 1);
            puVar6 = local_80 + 2;
            bVar16 = local_a8 == 0;
            local_a8 = local_a8 + 1;
          } while (bVar16);
          iVar2 = (int)local_88;
          uVar14 = 8 - iVar2;
          uVar13 = 0;
          do {
            pGVar5 = (Gia_Man_t *)local_58[uVar13 + 2];
            if ((pGVar5->nObjs == pGVar5->vCis->nSize + pGVar5->vCos->nSize + 1) ||
               (pGVar7 = (Gia_Man_t *)local_58[uVar13],
               pGVar7->nObjs == pGVar7->vCis->nSize + pGVar7->vCos->nSize + 1)) {
              pGVar5 = Gia_ManDup(pGVar5);
            }
            else if ((int)local_88 == 1) {
              pGVar5 = Gia_ManInterOne(pGVar5,pGVar7,1);
            }
            else {
              pGVar5 = Gia_ManInterOneInt(pGVar5,pGVar7,iVar2 + -1);
            }
            local_98[uVar13] = pGVar5;
            printf("%*sInter%d : ",(ulong)uVar14,"",uVar13 & 0xffffffff);
            pGVar5 = local_98[uVar13];
            Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
            pGVar7 = Abc_GiaSynthesizeInter(pGVar5);
            local_98[uVar13] = pGVar7;
            Gia_ManStop(pGVar5);
            printf("%*sInter%d : ",(ulong)uVar14,"",uVar13 & 0xffffffff);
            Gia_ManPrintStats(pGVar7,(Gps_Par_t *)0x0);
            uVar13 = uVar13 + 1;
          } while (uVar13 == 1);
          puVar6 = local_58;
          lVar15 = 0;
          do {
            lVar12 = 0;
            do {
              Gia_ManStop((Gia_Man_t *)puVar6[lVar12]);
              lVar12 = lVar12 + 1;
            } while (lVar12 == 1);
            puVar6 = puVar6 + 2;
            bVar16 = lVar15 == 0;
            lVar15 = lVar15 + 1;
          } while (bVar16);
          pGVar5 = Gia_ManDupMux(iVar4,local_98[1],local_98[0]);
          lVar15 = 0;
          do {
            Gia_ManStop(local_98[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          return pGVar5;
        }
      } while( true );
    }
  }
  pGVar5 = Gia_ManDup(pCof1);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManInterOneInt( Gia_Man_t * pCof1, Gia_Man_t * pCof0, int Depth )
{
    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pGia[2] = { pCof0, pCof1 };
    Gia_Man_t * pCof[2][2] = {{0}}, * pTemp;
    Gia_Man_t * pInter[2], * pFinal;
    Gia_Obj_t * pObj; 
    int i, n, m, Count, CountBest = 0, iVarBest = -1;
    // find PIs with the highest fanout
    Vec_Int_t * vFanCount;
    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        return Gia_ManDup(pCof1);
    vFanCount = Vec_IntStart( Gia_ManCiNum(pCof0) );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManForEachAnd( pGia[n], pObj, i )
        {
            if ( Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin0(pObj)), 1 );
            if ( Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin1(pObj)), 1 );
        }
    }
    Vec_IntForEachEntry( vFanCount, Count, i )
        if ( CountBest < Count )
        {
            CountBest = Count;
            iVarBest = i;
        }
    Vec_IntFree( vFanCount );
    // Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
    {
        pCof[n][m] = Gia_ManDupCofactorVar( pGia[n], iVarBest, m );
        pCof[n][m] = Acb_NtkEcoSynthesize( pTemp = pCof[n][m] );
        Gia_ManStop( pTemp );
        printf( "%*sCof%d%d : ", 8-Depth, "", n, m );
        Gia_ManPrintStats( pCof[n][m], NULL );
    }
    for ( m = 0; m < 2; m++ )
    {
        if ( Gia_ManAndNum(pCof[1][m]) == 0 || Gia_ManAndNum(pCof[0][m]) == 0 )
            pInter[m] = Gia_ManDup( pCof[1][m] );
        else if ( Depth == 1 )
            pInter[m] = Gia_ManInterOne( pCof[1][m], pCof[0][m], 1 );
        else
            pInter[m] = Gia_ManInterOneInt( pCof[1][m], pCof[0][m], Depth-1 );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
        pInter[m] = Abc_GiaSynthesizeInter( pTemp = pInter[m] );
        Gia_ManStop( pTemp );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
    }
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pCof[n][m] );
    pFinal = Gia_ManDupMux( iVarBest, pInter[1], pInter[0] );
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pInter[m] );
    return pFinal;
}